

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall
setup::info::load_entries<setup::directory_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::directory_entry,_std::allocator<setup::directory_entry>_> *result,
          enum_type entry_type)

{
  TypesafeBoolean p_Var1;
  ulong in_RCX;
  directory_entry *in_RDI;
  vector<setup::directory_entry,_std::allocator<setup::directory_entry>_> *in_R8;
  directory_entry entry;
  size_t i_1;
  size_t i;
  flags<setup::info::entry_types_Enum_,_21UL> *in_stack_fffffffffffffe58;
  size_type in_stack_fffffffffffffe68;
  directory_entry *in_stack_fffffffffffffe70;
  info *in_stack_fffffffffffffeb0;
  istream *in_stack_fffffffffffffeb8;
  directory_entry *in_stack_fffffffffffffec0;
  undefined8 local_48;
  undefined8 local_40;
  
  std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>::clear
            ((vector<setup::directory_entry,_std::allocator<setup::directory_entry>_> *)0x17a541);
  flags<setup::info::entry_types_Enum_,_21UL>::operator&
            (in_stack_fffffffffffffe58,(enum_type)((ulong)in_RDI >> 0x20));
  p_Var1 = ::flags::operator_cast_to_function_pointer
                     ((flags<setup::directory_entry::flags_Enum_,_5UL> *)0x17a56a);
  if (p_Var1 == (TypesafeBoolean)0x0) {
    for (local_48 = 0; local_48 < in_RCX; local_48 = local_48 + 1) {
      directory_entry::directory_entry(in_stack_fffffffffffffe70);
      directory_entry::load
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      directory_entry::~directory_entry(in_RDI);
    }
  }
  else {
    std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>::resize
              ((vector<setup::directory_entry,_std::allocator<setup::directory_entry>_> *)
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    for (local_40 = 0; local_40 < in_RCX; local_40 = local_40 + 1) {
      std::vector<setup::directory_entry,_std::allocator<setup::directory_entry>_>::operator[]
                (in_R8,local_40);
      directory_entry::load
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}